

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool float_isclose(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  double dVar1;
  double dVar2;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_fiber_t *fiber;
  double dVar3;
  double dVar4;
  gravity_float_t result;
  gravity_float_t abs_max;
  gravity_float_t abs_b;
  gravity_float_t abs_a;
  gravity_float_t abs_diff;
  gravity_float_t abs_tol;
  gravity_float_t rel_tol;
  char local_1068 [8];
  char _buffer [4096];
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_60;
  gravity_value_t v2;
  gravity_value_t v1;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  if (nargs < 2) {
    value_01.field_1.n = 1;
    value_01.isa = gravity_class_bool;
    gravity_vm_setslot(vm,value_01,rindex);
    vm_local._7_1_ = true;
  }
  else {
    dVar1 = (args->field_1).f;
    join_0x00000010_0x00000000_ = convert_value2float(vm,args[1]);
    if (_buffer._4088_8_ == 0) {
      snprintf(local_1068,0x1000,"Unable to convert object to Float");
      fiber = gravity_vm_fiber(vm);
      gravity_fiber_seterror(fiber,local_1068);
      value_00.field_1.n = 0;
      value_00.isa = gravity_class_null;
      gravity_vm_setslot(vm,value_00,rindex);
      vm_local._7_1_ = false;
    }
    else {
      abs_tol = 1e-09;
      abs_diff = 0.0;
      if ((2 < nargs) && (args[2].isa == gravity_class_float)) {
        abs_tol = args[2].field_1.f;
      }
      if ((3 < nargs) && (args[3].isa == gravity_class_float)) {
        abs_diff = args[3].field_1.f;
      }
      dVar3 = ABS(dVar1);
      dVar4 = ABS(local_60.f);
      dVar2 = dVar4;
      if (dVar4 <= dVar3) {
        dVar2 = dVar3;
      }
      dVar3 = abs_tol * (double)(~-(ulong)NAN(dVar3) & (ulong)dVar2 |
                                -(ulong)NAN(dVar3) & (ulong)dVar4);
      dVar2 = abs_diff;
      if (abs_diff <= dVar3) {
        dVar2 = dVar3;
      }
      value.field_1 =
           (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
           (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
           (long)(int)(uint)(ABS(dVar1 - local_60.f) <=
                            (double)(~-(ulong)NAN(dVar3) & (ulong)dVar2 |
                                    -(ulong)NAN(dVar3) & (ulong)abs_diff));
      value.isa = gravity_class_bool;
      gravity_vm_setslot(vm,value,rindex);
      vm_local._7_1_ = true;
    }
  }
  return vm_local._7_1_;
}

Assistant:

static bool float_isclose (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_VALUE(VALUE_FROM_BOOL(true), rindex);
    
    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_FLOAT(v2, true);
    gravity_float_t rel_tol = 1e-09;
    gravity_float_t abs_tol=0.0;
    if (nargs > 2 && VALUE_ISA_FLOAT(GET_VALUE(2))) rel_tol = VALUE_AS_FLOAT(GET_VALUE(2));
    if (nargs > 3 && VALUE_ISA_FLOAT(GET_VALUE(3))) abs_tol = VALUE_AS_FLOAT(GET_VALUE(3));
    
    // abs(a-b) <= max(rel_tol * max(abs(a), abs(b)), abs_tol)
    
    #if GRAVITY_ENABLE_DOUBLE
    gravity_float_t abs_diff = fabs(v1.f - v2.f);
    gravity_float_t abs_a = fabs(v1.f);
    gravity_float_t abs_b = fabs(v2.f);
    gravity_float_t abs_max = fmax(abs_a, abs_b);
    gravity_float_t result = fmax(rel_tol * abs_max, abs_tol);
    #else
    gravity_float_t abs_diff = fabsf(v1.f - v2.f);
    gravity_float_t abs_a = fabsf(v1.f);
    gravity_float_t abs_b = fabsf(v2.f);
    gravity_float_t abs_max = fmaxf(abs_a, abs_b);
    gravity_float_t result = fmaxf(rel_tol * abs_max, abs_tol);
    #endif
    
    RETURN_VALUE(VALUE_FROM_BOOL(abs_diff <= result), rindex);
}